

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O2

UWORD32 ihevcd_bits_num_bits_consumed(bitstrm_t *ps_bitstrm)

{
  return (ps_bitstrm->u4_bit_ofst +
         (*(int *)&ps_bitstrm->pu4_buf - *(int *)&ps_bitstrm->pu1_buf_base) * 8) - 0x40;
}

Assistant:

UWORD32  ihevcd_bits_num_bits_consumed(bitstrm_t *ps_bitstrm)
{
    UWORD32 u4_bits_consumed;
    /* 8 bytes are read in cur_word and nxt_word at the start. Hence */
    /* subtract 8 bytes */

    u4_bits_consumed = (UWORD32)(((UWORD8 *)ps_bitstrm->pu4_buf -
                                  (UWORD8 *)ps_bitstrm->pu1_buf_base - 8) <<
                                 3) + ps_bitstrm->u4_bit_ofst;
    return u4_bits_consumed;
}